

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

EventLoop * __thiscall Liby::EventLoop::robinLoop(EventLoop *this,int fd)

{
  EventLoop *pEVar1;
  int fd_local;
  EventLoop *this_local;
  
  pEVar1 = std::function<Liby::EventLoop_*(int)>::operator()(&this->rf_,fd);
  return pEVar1;
}

Assistant:

EventLoop *EventLoop::robinLoop(int fd) { return rf_(fd); }